

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseVariants(AsciiParser *this,VariantSelectionMap *out_map)

{
  uint8_t uVar1;
  StreamReader *pSVar2;
  ulong uVar3;
  bool bVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  string var;
  string key;
  ostringstream ss_e;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar4 = Expect(this,'{');
  if ((bVar4) && (bVar4 = SkipWhitespaceAndNewline(this,true), bVar4)) {
    do {
      pSVar2 = this->_sr;
      uVar3 = pSVar2->idx_;
      if (((pSVar2->length_ <= uVar3) || (uVar1 = pSVar2->binary_[uVar3], uVar1 == '\0')) ||
         (pSVar2->idx_ = uVar3 + 1, uVar1 == '}')) {
        bVar4 = SkipWhitespaceAndNewline(this,true);
        return bVar4;
      }
      if ((long)uVar3 < 0) {
        return false;
      }
      pSVar2->idx_ = uVar3;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_local_buf[0] = '\0';
      local_208._M_string_length = 0;
      local_208.field_2._M_local_buf[0] = '\0';
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      bVar4 = ParseVariantsElement(this,&local_1e8,&local_208);
      if (bVar4) {
        bVar4 = SkipWhitespaceAndNewline(this,true);
        if (!bVar4) goto LAB_00321788;
        pmVar5 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](out_map,&local_1e8);
        ::std::__cxx11::string::_M_assign((string *)pmVar5);
        bVar4 = true;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ParseVariants",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x42b);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Failed to parse an element of `variants`.",0x29);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        ::std::ios_base::~ios_base(local_138);
LAB_00321788:
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                 local_208.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                 local_1e8.field_2._M_local_buf[0]) + 1);
      }
    } while (bVar4);
  }
  return false;
}

Assistant:

bool AsciiParser::ParseVariants(VariantSelectionMap *out_map) {
  // '{' (string name '=' value)+ '}'
  if (!Expect('{')) {
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      std::string key;
      std::string var;
      if (!ParseVariantsElement(&key, &var)) {
        PUSH_ERROR_AND_RETURN("Failed to parse an element of `variants`.");
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }

      DCOUT("Add to variants: " << key);
      (*out_map)[key] = var;
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  return true;
}